

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ConstructBloomFilter(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel,Bitmask notReady)

{
  byte *pbVar1;
  u8 uVar2;
  ushort uVar3;
  int iVar4;
  Parse *pParse;
  Vdbe *p;
  SrcList *pSrcList;
  Index *pIdx;
  IndexedExpr *pIVar5;
  IndexedExpr *pIVar6;
  byte bVar7;
  int iVar8;
  int dest;
  int iVar9;
  ulong uVar10;
  long lVar11;
  Op *pOVar12;
  uint iIdxCol;
  WhereTerm *pWVar13;
  int iVar14;
  uint nReg;
  WhereTerm *pWVar15;
  WhereLoop *pWVar16;
  
  pParse = pWInfo->pParse;
  p = pParse->pVdbe;
  pWVar16 = pLevel->pWLoop;
  pIVar5 = pParse->pIdxEpr;
  pIVar6 = pParse->pIdxPartExpr;
  pParse->pIdxEpr = (IndexedExpr *)0x0;
  pParse->pIdxPartExpr = (IndexedExpr *)0x0;
  iVar8 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
  do {
    sqlite3WhereExplainBloomFilter(pParse,(WhereInfo *)pWInfo->pTabList,pLevel);
    dest = pParse->nLabel + -1;
    pParse->nLabel = dest;
    iVar4 = pLevel->iTabCur;
    iVar14 = pParse->nMem + 1;
    pParse->nMem = iVar14;
    pLevel->regFilter = iVar14;
    pSrcList = pWInfo->pTabList;
    bVar7 = pLevel->iFrom;
    uVar10 = sqlite3LogEstToInt((pSrcList->a[bVar7].pSTab)->nRowLogEst);
    if (9999999 < uVar10) {
      uVar10 = 10000000;
    }
    if (uVar10 < 0x2711) {
      uVar10 = 10000;
    }
    sqlite3VdbeAddOp3(p,0x4d,(int)uVar10,iVar14,0);
    iVar14 = sqlite3VdbeAddOp3(p,0x24,iVar4,0,0);
    lVar11 = (long)(pWInfo->sWC).nTerm;
    if (0 < lVar11) {
      pWVar15 = (pWInfo->sWC).a;
      pWVar13 = pWVar15 + lVar11;
      do {
        if (((pWVar15->wtFlags & 2) == 0) &&
           (iVar9 = sqlite3ExprIsSingleTableConstraint(pWVar15->pExpr,pSrcList,(uint)bVar7,0),
           iVar9 != 0)) {
          sqlite3ExprIfFalse(pParse,pWVar15->pExpr,dest,0x10);
        }
        pWVar15 = pWVar15 + 1;
      } while (pWVar15 < pWVar13);
    }
    if ((pWVar16->wsFlags & 0x100) == 0) {
      pIdx = (pWVar16->u).btree.pIndex;
      uVar3 = (pWVar16->u).btree.nEq;
      nReg = (uint)uVar3;
      iVar9 = sqlite3GetTempRange(pParse,nReg);
      if (uVar3 == 0) {
        sqlite3VdbeAddOp4Int(p,0xb7,pLevel->regFilter,0,iVar9,nReg);
      }
      else {
        iIdxCol = 0;
        do {
          sqlite3ExprCodeLoadIndexColumn(pParse,pIdx,iVar4,iIdxCol,iVar9 + iIdxCol);
          iIdxCol = iIdxCol + 1;
        } while (nReg != iIdxCol);
        sqlite3VdbeAddOp4Int(p,0xb7,pLevel->regFilter,0,iVar9,nReg);
        if (nReg == 1) {
          if (iVar9 != 0) {
            bVar7 = pParse->nTempReg;
            if ((ulong)bVar7 < 8) {
              pParse->nTempReg = bVar7 + 1;
              pParse->aTempReg[bVar7] = iVar9;
            }
          }
          goto LAB_00194d38;
        }
      }
      if (pParse->nRangeReg < (int)nReg) {
        pParse->nRangeReg = nReg;
        pParse->iRangeReg = iVar9;
      }
    }
    else {
      if (pParse->nTempReg == '\0') {
        iVar9 = pParse->nMem + 1;
        pParse->nMem = iVar9;
      }
      else {
        bVar7 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar7;
        iVar9 = pParse->aTempReg[bVar7];
      }
      sqlite3VdbeAddOp3(p,0x87,iVar4,iVar9,0);
      sqlite3VdbeAddOp4Int(p,0xb7,pLevel->regFilter,0,iVar9,1);
      if (iVar9 != 0) {
        bVar7 = pParse->nTempReg;
        if ((ulong)bVar7 < 8) {
          pParse->nTempReg = bVar7 + 1;
          pParse->aTempReg[bVar7] = iVar9;
        }
      }
    }
LAB_00194d38:
    sqlite3VdbeResolveLabel(p,dest);
    sqlite3VdbeAddOp3(p,0x27,pLevel->iTabCur,iVar14 + 1,0);
    iVar4 = p->nOp;
    uVar2 = p->db->mallocFailed;
    pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
    if (uVar2 == '\0') {
      pOVar12 = p->aOp + iVar14;
    }
    pOVar12->p2 = iVar4;
    pbVar1 = (byte *)((long)&pWVar16->wsFlags + 2);
    *pbVar1 = *pbVar1 & 0xbf;
    if ((pParse->db->dbOptFlags & 0x100000) != 0) break;
    bVar7 = pWInfo->nLevel;
    iLevel = iLevel + 1;
    if (iLevel < (int)(uint)bVar7) {
      pLevel = pWInfo->a + iLevel;
      lVar11 = 0;
      while (((((pWInfo->pTabList->a[pLevel->iFrom].fg.jointype & 0x48) != 0 ||
               (pWVar16 = pLevel->pWLoop, pWVar16 == (WhereLoop *)0x0)) ||
              ((pWVar16->prereq & notReady) != 0)) || ((pWVar16->wsFlags & 0x400004) != 0x400000)))
      {
        lVar11 = lVar11 + -1;
        pLevel = pLevel + 1;
        if ((long)iLevel - (ulong)(uint)bVar7 == lVar11) goto LAB_00194e25;
      }
      iLevel = iLevel - (int)lVar11;
    }
  } while (iLevel < (int)(uint)bVar7);
LAB_00194e25:
  if (uVar2 == '\0') {
    pOVar12 = p->aOp + iVar8;
  }
  else {
    pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar12->p2 = iVar4;
  pParse->pIdxEpr = pIVar5;
  pParse->pIdxPartExpr = pIVar6;
  return;
}

Assistant:

static SQLITE_NOINLINE void sqlite3ConstructBloomFilter(
  WhereInfo *pWInfo,    /* The WHERE clause */
  int iLevel,           /* Index in pWInfo->a[] that is pLevel */
  WhereLevel *pLevel,   /* Make a Bloom filter for this FROM term */
  Bitmask notReady      /* Loops that are not ready */
){
  int addrOnce;                        /* Address of opening OP_Once */
  int addrTop;                         /* Address of OP_Rewind */
  int addrCont;                        /* Jump here to skip a row */
  const WhereTerm *pTerm;              /* For looping over WHERE clause terms */
  const WhereTerm *pWCEnd;             /* Last WHERE clause term */
  Parse *pParse = pWInfo->pParse;      /* Parsing context */
  Vdbe *v = pParse->pVdbe;             /* VDBE under construction */
  WhereLoop *pLoop = pLevel->pWLoop;   /* The loop being coded */
  int iCur;                            /* Cursor for table getting the filter */
  IndexedExpr *saved_pIdxEpr;          /* saved copy of Parse.pIdxEpr */
  IndexedExpr *saved_pIdxPartExpr;     /* saved copy of Parse.pIdxPartExpr */

  saved_pIdxEpr = pParse->pIdxEpr;
  saved_pIdxPartExpr = pParse->pIdxPartExpr;
  pParse->pIdxEpr = 0;
  pParse->pIdxPartExpr = 0;

  assert( pLoop!=0 );
  assert( v!=0 );
  assert( pLoop->wsFlags & WHERE_BLOOMFILTER );
  assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 );

  addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  do{
    const SrcList *pTabList;
    const SrcItem *pItem;
    const Table *pTab;
    u64 sz;
    int iSrc;
    sqlite3WhereExplainBloomFilter(pParse, pWInfo, pLevel);
    addrCont = sqlite3VdbeMakeLabel(pParse);
    iCur = pLevel->iTabCur;
    pLevel->regFilter = ++pParse->nMem;

    /* The Bloom filter is a Blob held in a register.  Initialize it
    ** to zero-filled blob of at least 80K bits, but maybe more if the
    ** estimated size of the table is larger.  We could actually
    ** measure the size of the table at run-time using OP_Count with
    ** P3==1 and use that value to initialize the blob.  But that makes
    ** testing complicated.  By basing the blob size on the value in the
    ** sqlite_stat1 table, testing is much easier.
    */
    pTabList = pWInfo->pTabList;
    iSrc = pLevel->iFrom;
    pItem = &pTabList->a[iSrc];
    assert( pItem!=0 );
    pTab = pItem->pSTab;
    assert( pTab!=0 );
    sz = sqlite3LogEstToInt(pTab->nRowLogEst);
    if( sz<10000 ){
      sz = 10000;
    }else if( sz>10000000 ){
      sz = 10000000;
    }
    sqlite3VdbeAddOp2(v, OP_Blob, (int)sz, pLevel->regFilter);

    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    pWCEnd = &pWInfo->sWC.a[pWInfo->sWC.nTerm];
    for(pTerm=pWInfo->sWC.a; pTerm<pWCEnd; pTerm++){
      Expr *pExpr = pTerm->pExpr;
      if( (pTerm->wtFlags & TERM_VIRTUAL)==0
       && sqlite3ExprIsSingleTableConstraint(pExpr, pTabList, iSrc, 0)
      ){
        sqlite3ExprIfFalse(pParse, pTerm->pExpr, addrCont, SQLITE_JUMPIFNULL);
      }
    }
    if( pLoop->wsFlags & WHERE_IPK ){
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, r1);
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, 1);
      sqlite3ReleaseTempReg(pParse, r1);
    }else{
      Index *pIdx = pLoop->u.btree.pIndex;
      int n = pLoop->u.btree.nEq;
      int r1 = sqlite3GetTempRange(pParse, n);
      int jj;
      for(jj=0; jj<n; jj++){
        assert( pIdx->pTable==pItem->pSTab );
        sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iCur, jj, r1+jj);
      }
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, n);
      sqlite3ReleaseTempRange(pParse, r1, n);
    }
    sqlite3VdbeResolveLabel(v, addrCont);
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addrTop);
    pLoop->wsFlags &= ~WHERE_BLOOMFILTER;
    if( OptimizationDisabled(pParse->db, SQLITE_BloomPulldown) ) break;
    while( ++iLevel < pWInfo->nLevel ){
      const SrcItem *pTabItem;
      pLevel = &pWInfo->a[iLevel];
      pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
      if( pTabItem->fg.jointype & (JT_LEFT|JT_LTORJ) ) continue;
      pLoop = pLevel->pWLoop;
      if( NEVER(pLoop==0) ) continue;
      if( pLoop->prereq & notReady ) continue;
      if( (pLoop->wsFlags & (WHERE_BLOOMFILTER|WHERE_COLUMN_IN))
                 ==WHERE_BLOOMFILTER
      ){
        /* This is a candidate for bloom-filter pull-down (early evaluation).
        ** The test that WHERE_COLUMN_IN is omitted is important, as we are
        ** not able to do early evaluation of bloom filters that make use of
        ** the IN operator */
        break;
      }
    }
  }while( iLevel < pWInfo->nLevel );
  sqlite3VdbeJumpHere(v, addrOnce);
  pParse->pIdxEpr = saved_pIdxEpr;
  pParse->pIdxPartExpr = saved_pIdxPartExpr;
}